

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_loop_t *unaff_RBX;
  undefined1 *puVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  undefined1 auStack_f90 [16];
  uv_loop_t *puStack_f80;
  uv_connect_t uStack_f78;
  uv_pipe_t uStack_f10;
  long alStack_e28 [64];
  uv_loop_t *puStack_c28;
  long lStack_c18;
  long lStack_c10;
  undefined1 auStack_c08 [264];
  uv_pipe_t uStack_b00;
  uv_loop_t auStack_a18 [2];
  undefined1 uStack_219;
  uv_loop_t *puStack_218;
  long lStack_208;
  long lStack_200;
  uv_pipe_t uStack_1f8;
  uv_loop_t *puStack_110;
  long local_100;
  long local_f8;
  uv_pipe_t local_f0;
  
  puStack_110 = (uv_loop_t *)0x1ac94a;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1ac959;
  iVar1 = uv_pipe_init(puVar2,&local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    puStack_110 = (uv_loop_t *)0x1ac98a;
    iVar1 = uv_pipe_bind(&local_f0,"/tmp/uv-test-sock");
    local_f8 = (long)iVar1;
    local_100 = 0;
    if (local_f8 != 0) goto LAB_001aca8b;
    puStack_110 = (uv_loop_t *)0x1ac9bb;
    iVar1 = uv_pipe_bind(&local_f0,"/tmp/uv-test-sock2");
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001aca9a;
    puStack_110 = (uv_loop_t *)0x1ac9ec;
    uv_close((uv_handle_t *)&local_f0,close_cb);
    puStack_110 = (uv_loop_t *)0x1ac9f1;
    puVar2 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1ac9fb;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_f8 = 1;
    local_100 = (long)close_cb_called;
    if (local_100 != 1) goto LAB_001acaa9;
    puStack_110 = (uv_loop_t *)0x1aca25;
    unaff_RBX = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1aca39;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_loop_t *)0x1aca43;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_f8 = 0;
    puStack_110 = (uv_loop_t *)0x1aca51;
    puVar2 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1aca59;
    iVar1 = uv_loop_close(puVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      puStack_110 = (uv_loop_t *)0x1aca71;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_110 = (uv_loop_t *)0x1aca8b;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001aca8b:
    puStack_110 = (uv_loop_t *)0x1aca9a;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001aca9a:
    puStack_110 = (uv_loop_t *)0x1acaa9;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001acaa9:
    puStack_110 = (uv_loop_t *)0x1acab8;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_110 = (uv_loop_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_218 = (uv_loop_t *)0x1acad4;
  puStack_110 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_218 = (uv_loop_t *)0x1acae3;
  iVar1 = uv_pipe_init(puVar2,&uStack_1f8,0);
  lStack_200 = (long)iVar1;
  lStack_208 = 0;
  if (lStack_200 == 0) {
    puStack_218 = (uv_loop_t *)0x1acb14;
    iVar1 = uv_listen((uv_stream_t *)&uStack_1f8,0x1000,(uv_connection_cb)0x0);
    lStack_200 = (long)iVar1;
    lStack_208 = -0x16;
    if (lStack_200 != -0x16) goto LAB_001acbe0;
    puStack_218 = (uv_loop_t *)0x1acb45;
    uv_close((uv_handle_t *)&uStack_1f8,close_cb);
    puStack_218 = (uv_loop_t *)0x1acb4a;
    puVar2 = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1acb54;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_200 = 1;
    lStack_208 = (long)close_cb_called;
    if (lStack_208 != 1) goto LAB_001acbef;
    puStack_218 = (uv_loop_t *)0x1acb7a;
    unaff_RBX = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1acb8e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_218 = (uv_loop_t *)0x1acb98;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_200 = 0;
    puStack_218 = (uv_loop_t *)0x1acba6;
    puVar2 = uv_default_loop();
    puStack_218 = (uv_loop_t *)0x1acbae;
    iVar1 = uv_loop_close(puVar2);
    lStack_208 = (long)iVar1;
    if (lStack_200 == lStack_208) {
      puStack_218 = (uv_loop_t *)0x1acbc6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_218 = (uv_loop_t *)0x1acbe0;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001acbe0:
    puStack_218 = (uv_loop_t *)0x1acbef;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001acbef:
    puStack_218 = (uv_loop_t *)0x1acbfe;
    run_test_pipe_listen_without_bind_cold_3();
  }
  puStack_218 = (uv_loop_t *)run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  puVar2 = auStack_a18;
  auStack_c08._232_8_ = (uv_close_cb)0x1acc2f;
  puStack_218 = unaff_RBX;
  memset(puVar2,0x2e,0x7ff);
  uStack_219 = 0;
  auStack_c08._232_8_ = (uv_close_cb)0x1acc3b;
  puVar3 = uv_default_loop();
  auStack_c08._232_8_ = (uv_close_cb)0x1acc4a;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)(auStack_c08 + 0x108),0);
  if (iVar1 == 0) {
    auStack_c08._232_8_ = (uv_close_cb)0x1acc64;
    iVar1 = uv_pipe_bind((uv_pipe_t *)(auStack_c08 + 0x108),(char *)auStack_a18);
    if (iVar1 != -0x24) goto LAB_001accf7;
    auStack_c08._232_8_ = (uv_close_cb)0x1acc7e;
    uv_close((uv_handle_t *)(auStack_c08 + 0x108),close_cb);
    auStack_c08._232_8_ = (uv_close_cb)0x1acc83;
    puVar3 = uv_default_loop();
    auStack_c08._232_8_ = (uv_close_cb)0x1acc8d;
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001accfc;
    auStack_c08._232_8_ = (uv_close_cb)0x1acc9b;
    puVar2 = uv_default_loop();
    auStack_c08._232_8_ = (uv_close_cb)0x1accaf;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_c08._232_8_ = (uv_close_cb)0x1accb9;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_c08._256_8_ = (uv_handle_t *)0x0;
    auStack_c08._232_8_ = (uv_close_cb)0x1accc7;
    puVar3 = uv_default_loop();
    auStack_c08._232_8_ = (uv_close_cb)0x1acccf;
    iVar1 = uv_loop_close(puVar3);
    auStack_c08._248_8_ = SEXT48(iVar1);
    if (auStack_c08._256_8_ == auStack_c08._248_8_) {
      auStack_c08._232_8_ = (uv_close_cb)0x1acce7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_c08._232_8_ = (uv_close_cb)0x1accf7;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001accf7:
    auStack_c08._232_8_ = (uv_close_cb)0x1accfc;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001accfc:
    auStack_c08._232_8_ = (uv_close_cb)0x1acd01;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  auStack_c08._232_8_ = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  puStack_c28 = (uv_loop_t *)0x1acd1d;
  auStack_c08._232_8_ = puVar2;
  puVar3 = uv_default_loop();
  puStack_c28 = (uv_loop_t *)0x1acd2c;
  iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)auStack_c08,0);
  lStack_c10 = (long)iVar1;
  lStack_c18 = 0;
  if (lStack_c10 == 0) {
    puVar2 = (uv_loop_t *)auStack_c08;
    puStack_c28 = (uv_loop_t *)0x1acd5b;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    puStack_c28 = (uv_loop_t *)0x1acd6a;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar2,"/tmp/uv-test-sock");
    lStack_c10 = (long)iVar1;
    lStack_c18 = -0x16;
    if (lStack_c10 != -0x16) goto LAB_001ace55;
    puStack_c28 = (uv_loop_t *)0x1acd9b;
    iVar1 = uv_listen((uv_stream_t *)auStack_c08,0x1000,(uv_connection_cb)0x0);
    lStack_c10 = (long)iVar1;
    lStack_c18 = -0x16;
    if (lStack_c10 != -0x16) goto LAB_001ace64;
    puStack_c28 = (uv_loop_t *)0x1acdc0;
    puVar3 = uv_default_loop();
    puStack_c28 = (uv_loop_t *)0x1acdca;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_c10 = (long)iVar1;
    lStack_c18 = 0;
    if (lStack_c10 != 0) goto LAB_001ace73;
    puStack_c28 = (uv_loop_t *)0x1acdef;
    puVar2 = uv_default_loop();
    puStack_c28 = (uv_loop_t *)0x1ace03;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_c28 = (uv_loop_t *)0x1ace0d;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_c10 = 0;
    puStack_c28 = (uv_loop_t *)0x1ace1b;
    puVar3 = uv_default_loop();
    puStack_c28 = (uv_loop_t *)0x1ace23;
    iVar1 = uv_loop_close(puVar3);
    lStack_c18 = (long)iVar1;
    if (lStack_c10 == lStack_c18) {
      puStack_c28 = (uv_loop_t *)0x1ace3b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_c28 = (uv_loop_t *)0x1ace55;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001ace55:
    puStack_c28 = (uv_loop_t *)0x1ace64;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001ace64:
    puStack_c28 = (uv_loop_t *)0x1ace73;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001ace73:
    puStack_c28 = (uv_loop_t *)0x1ace82;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  puStack_c28 = (uv_loop_t *)run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  puVar4 = auStack_f90 + 8;
  auStack_f90._0_8_ = (void *)0x1ace9e;
  puStack_c28 = puVar2;
  puVar2 = uv_default_loop();
  auStack_f90._0_8_ = (void *)0x1acead;
  iVar1 = uv_pipe_init(puVar2,&uStack_f10,0);
  alStack_e28[0] = (long)iVar1;
  uStack_f78.data = (uv_loop_t *)0x0;
  if (alStack_e28[0] == 0) {
    auStack_f90._0_8_ = (void *)0x1aceed;
    memset(alStack_e28,0x40,0x200);
    uStack_f78.data = (uv_loop_t *)0xffffffffffffffdc;
    auStack_f90._0_8_ = (void *)0x1acf0d;
    iVar1 = uv_pipe_bind2(&uStack_f10,(char *)alStack_e28,0x200,1);
    auStack_f90._8_8_ = SEXT48(iVar1);
    if (uStack_f78.data != (void *)auStack_f90._8_8_) goto LAB_001ad0c1;
    auStack_f90._8_8_ = (uv_loop_t *)0xffffffffffffffdc;
    auStack_f90._0_8_ = (void *)0x1acf53;
    iVar1 = uv_pipe_connect2(&uStack_f78,&uStack_f10,(char *)alStack_e28,0x200,1,abort);
    puStack_f80 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_f90._8_8_ != puStack_f80) goto LAB_001ad0ce;
    auStack_f90._0_8_ = (void *)0x1acf6e;
    puVar2 = uv_default_loop();
    auStack_f90._0_8_ = (void *)0x1acf78;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_f90._8_8_ = SEXT48(iVar1);
    puStack_f80 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f90._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0db;
    auStack_f90._8_8_ = (uv_loop_t *)0xffffffffffffffea;
    auStack_f90._0_8_ = (void *)0x1acfaf;
    iVar1 = uv_pipe_bind(&uStack_f10,"");
    puStack_f80 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_f90._8_8_ != puStack_f80) goto LAB_001ad0e8;
    auStack_f90._0_8_ = (void *)0x1acfe2;
    uv_pipe_connect(&uStack_f78,&uStack_f10,"",connect_overlong_cb);
    auStack_f90._0_8_ = (void *)0x1acfe7;
    puVar2 = uv_default_loop();
    auStack_f90._0_8_ = (void *)0x1acff1;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_f90._8_8_ = SEXT48(iVar1);
    puStack_f80 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f90._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad0f5;
    auStack_f90._8_8_ = (uv_loop_t *)0x1;
    puStack_f80 = (uv_loop_t *)(long)connect_cb_called;
    if (puStack_f80 != (uv_loop_t *)0x1) goto LAB_001ad102;
    auStack_f90._8_8_ = (uv_loop_t *)0x1;
    puStack_f80 = (uv_loop_t *)(long)close_cb_called;
    if (puStack_f80 == (uv_loop_t *)0x1) {
      auStack_f90._0_8_ = (void *)0x1ad05a;
      puVar2 = uv_default_loop();
      auStack_f90._0_8_ = (void *)0x1ad06e;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_f90._0_8_ = (void *)0x1ad078;
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_f90._8_8_ = (uv_loop_t *)0x0;
      auStack_f90._0_8_ = (void *)0x1ad085;
      puVar2 = uv_default_loop();
      auStack_f90._0_8_ = (void *)0x1ad08d;
      iVar1 = uv_loop_close(puVar2);
      puStack_f80 = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)auStack_f90._8_8_ == puStack_f80) {
        auStack_f90._0_8_ = (void *)0x1ad0a4;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ad11c;
    }
  }
  else {
    auStack_f90._0_8_ = (void *)0x1ad0c1;
    run_test_pipe_overlong_path_cold_1();
LAB_001ad0c1:
    auStack_f90._0_8_ = (void *)0x1ad0ce;
    run_test_pipe_overlong_path_cold_2();
LAB_001ad0ce:
    auStack_f90._0_8_ = (void *)0x1ad0db;
    run_test_pipe_overlong_path_cold_3();
LAB_001ad0db:
    auStack_f90._0_8_ = (void *)0x1ad0e8;
    run_test_pipe_overlong_path_cold_4();
LAB_001ad0e8:
    auStack_f90._0_8_ = (void *)0x1ad0f5;
    run_test_pipe_overlong_path_cold_5();
LAB_001ad0f5:
    auStack_f90._0_8_ = (void *)0x1ad102;
    run_test_pipe_overlong_path_cold_6();
LAB_001ad102:
    auStack_f90._0_8_ = (void *)0x1ad10f;
    run_test_pipe_overlong_path_cold_7();
  }
  auStack_f90._0_8_ = (void *)0x1ad11c;
  run_test_pipe_overlong_path_cold_8();
LAB_001ad11c:
  iVar1 = (int)&puStack_f80;
  auStack_f90._0_8_ = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  auStack_f90._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_f90._0_8_ == (void *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(uv_handle_t **)(puVar4 + 0x50),close_cb);
    return extraout_EAX;
  }
  handle = (uv_handle_t *)auStack_f90;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}